

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

int lys_set_enabled(lys_module *module)

{
  byte *pbVar1;
  uint16_t *puVar2;
  lys_module *node;
  lys_node *plVar3;
  long lVar4;
  int iVar5;
  ly_set *mods;
  ly_set *set;
  ly_set *plVar6;
  lys_node *leafref;
  lys_node *plVar7;
  lys_node *plVar8;
  lys_import *plVar9;
  char *format;
  ulong uVar10;
  ulong uVar11;
  ly_ctx *ctx;
  lys_ident *der;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  lys_node *plVar15;
  bool bVar16;
  uint local_34 [2];
  uint s;
  
  if (module == (lys_module *)0x0) {
    format = "Invalid arguments (%s()).";
    pcVar12 = "lys_set_enabled";
    ctx = (ly_ctx *)0x0;
LAB_0010d6ce:
    ly_log(ctx,LY_LLERR,LY_EINVAL,format,pcVar12);
    iVar5 = 1;
  }
  else {
    iVar5 = 0;
    if ((module->field_0x40 & 0x40) != 0) {
      ctx = module->ctx;
      if ((ulong)ctx->internal_module_count != 0) {
        uVar10 = 0;
        do {
          if ((ctx->models).list[uVar10] == module) {
            pcVar12 = module->name;
            format = "Internal module \"%s\" cannot be removed.";
            goto LAB_0010d6ce;
          }
          uVar10 = uVar10 + 1;
        } while (ctx->internal_module_count != uVar10);
      }
      mods = ly_set_new();
      set = ly_set_new();
      lys_set_enabled_(mods,module);
LAB_0010d37a:
      if ((int)(uint)ctx->internal_module_count < (ctx->models).used) {
        uVar10 = (ulong)ctx->internal_module_count;
        do {
          node = (ctx->models).list[uVar10];
          if (((node->field_0x40 & 0x40) != 0) && (iVar5 = ly_set_contains(set,node), iVar5 == -1))
          {
            uVar11 = (ulong)node->imp_size;
            bVar16 = uVar11 != 0;
            if (bVar16) {
              plVar9 = node->imp;
              if ((plVar9->module->field_0x40 & 0x40) == 0) {
                uVar13 = 0;
                do {
                  plVar9 = plVar9 + 1;
                  if (uVar11 - 1 == uVar13) goto LAB_0010d3ff;
                  uVar13 = uVar13 + 1;
                } while ((plVar9->module->field_0x40 & 0x40) == 0);
                bVar16 = uVar13 < uVar11;
              }
              if (bVar16) goto LAB_0010d3ae;
            }
LAB_0010d3ff:
            if (uVar11 != 0) {
              uVar13 = 0;
              do {
                if (mods->number != 0) {
                  lVar14 = 0;
                  do {
                    if (node->imp[uVar13].module == (lys_module *)(mods->set).s[lVar14]) {
                      node->field_0x40 = node->field_0x40 & 0xbf;
                      ly_set_add(mods,node,0);
                      if (node->inc_size != '\0') {
                        lVar14 = 0;
                        uVar10 = 0;
                        do {
                          pbVar1 = (byte *)(*(long *)(node->inc->rev + lVar14 + -8) + 0x40);
                          *pbVar1 = *pbVar1 & 0xbf;
                          uVar10 = uVar10 + 1;
                          lVar14 = lVar14 + 0x30;
                        } while (uVar10 < node->inc_size);
                      }
                      goto LAB_0010d37a;
                    }
                    lVar14 = lVar14 + 1;
                  } while (mods->number != (uint)lVar14);
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 != uVar11);
            }
            ly_set_add(set,node,0);
          }
LAB_0010d3ae:
          uVar10 = uVar10 + 1;
        } while ((int)uVar10 < (ctx->models).used);
      }
      if (mods->number != 0) {
        uVar10 = 0;
        do {
          plVar3 = (mods->set).s[uVar10];
          if ((((ulong)plVar3->parent & 0x80) != 0) && (*(short *)&plVar3->child != 0)) {
            uVar11 = 0;
            do {
              if (plVar3[1].dsc[uVar11 * 0x48 + 0x1f] != '\0') {
                der = (lys_ident *)(plVar3[1].dsc + uVar11 * 0x48);
                uVar13 = 0;
                do {
                  resolve_identity_backlink_update(der,der->base[uVar13]);
                  uVar13 = uVar13 + 1;
                  der = (lys_ident *)(plVar3[1].dsc + uVar11 * 0x48);
                } while (uVar13 < der->base_size);
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 < *(ushort *)&plVar3->child);
          }
          if (*(char *)((long)&plVar3->child + 4) != '\0') {
            uVar11 = 0;
            do {
              pcVar12 = plVar3[1].ref;
              lVar14 = uVar11 * 0x40;
              if (pcVar12[lVar14 + 0x1b] != '\0') {
                uVar13 = 0;
                do {
                  resolve_iffeature_getsizes
                            ((lys_iffeature *)(*(long *)(pcVar12 + lVar14 + 0x28) + uVar13 * 0x20),
                             (uint *)0x0,local_34);
                  while (bVar16 = local_34[0] != 0, local_34[0] = local_34[0] - 1, bVar16) {
                    lVar4 = *(long *)(*(long *)(*(long *)(plVar3[1].ref + lVar14 + 0x28) + 0x10 +
                                               uVar13 * 0x20) + (ulong)local_34[0] * 8);
                    if (*(long *)(lVar4 + 0x38) == 0) {
                      plVar6 = ly_set_new();
                      *(ly_set **)(lVar4 + 0x38) = plVar6;
                    }
                    ly_set_add(*(ly_set **)(lVar4 + 0x38),plVar3[1].ref + lVar14,1);
                  }
                  uVar13 = uVar13 + 1;
                  pcVar12 = plVar3[1].ref;
                } while (uVar13 < (byte)pcVar12[lVar14 + 0x1b]);
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 < *(byte *)((long)&plVar3->child + 4));
          }
          plVar15 = *(lys_node **)&plVar3[1].nodetype;
joined_r0x0010d5dc:
          leafref = plVar15;
          if (leafref != (lys_node *)0x0) {
            if (leafref->nodetype != LYS_GROUPING) {
              if (((leafref->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
                 (*(int *)&leafref[1].ref == 9)) {
                lys_leaf_add_leafref_target(*(lys_node_leaf **)&leafref[1].nodetype,leafref);
              }
              if ((leafref->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
                plVar15 = leafref->child;
              }
              else {
                plVar15 = (lys_node *)0x0;
              }
              if (plVar15 != (lys_node *)0x0) goto LAB_0010d62e;
            }
            if (leafref == *(lys_node **)&plVar3[1].nodetype) goto LAB_0010d662;
            do {
              plVar15 = leafref->next;
LAB_0010d62e:
              if (plVar15 != (lys_node *)0x0) break;
              leafref = lys_parent(leafref);
              plVar7 = lys_parent(leafref);
              plVar8 = lys_parent(*(lys_node **)&plVar3[1].nodetype);
            } while (plVar7 != plVar8);
            goto joined_r0x0010d5dc;
          }
LAB_0010d662:
          uVar10 = uVar10 + 1;
        } while (uVar10 < mods->number);
      }
      if (mods->number != 0) {
        uVar10 = 0;
        do {
          if ((((lys_module *)(mods->set).s[uVar10])->field_0x40 & 0x80) != 0) {
            lys_sub_module_apply_devs_augs((lys_module *)(mods->set).s[uVar10]);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < mods->number);
      }
      ly_set_free(mods);
      ly_set_free(set);
      puVar2 = &(ctx->models).module_set_id;
      *puVar2 = *puVar2 + 1;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

API int
lys_set_enabled(const struct lys_module *module)
{
    struct ly_ctx *ctx; /* shortcut */
    struct lys_module *mod;
    struct ly_set *mods, *disabled;
    int i;
    unsigned int u, v, w;

    if (!module) {
        LOGARG;
        return EXIT_FAILURE;
    } else if (!module->disabled) {
        /* already enabled module */
        return EXIT_SUCCESS;
    }
    mod = (struct lys_module *)module;
    ctx = mod->ctx;

    /* avoid disabling internal modules */
    for (i = 0; i < ctx->internal_module_count; i++) {
        if (mod == ctx->models.list[i]) {
            LOGERR(ctx, LY_EINVAL, "Internal module \"%s\" cannot be removed.", mod->name);
            return EXIT_FAILURE;
        }
    }

    mods = ly_set_new();
    disabled = ly_set_new();

    /* enable the module, including its dependencies */
    lys_set_enabled_(mods, mod);

    /* we will go through the all disabled modules in the context, if the module has no dependency (import)
     * that is still disabled AND at least one of its imported module is from the set we are enabling now,
     * it is going to be also enabled. This way we try to revert everething that was possibly done by
     * lys_set_disabled(). */
checkdependency:
    for (i = ctx->internal_module_count; i < ctx->models.used; i++) {
        mod = ctx->models.list[i]; /* shortcut */
        if (!mod->disabled || ly_set_contains(disabled, mod) != -1) {
            /* skip the enabled modules */
            continue;
        }

        /* check imported modules */
        for (u = 0; u < mod->imp_size; u++) {
            if (mod->imp[u].module->disabled) {
                /* it has disabled dependency so it must stay disabled */
                break;
            }
        }
        if (u < mod->imp_size) {
            /* it has disabled dependency, continue with the next module in the context */
            continue;
        }

        /* get know if at least one of the imported modules is being enabled this time */
        for (u = 0; u < mod->imp_size; u++) {
            for (v = 0; v < mods->number; v++) {
                if (mod->imp[u].module == mods->set.g[v]) {
                    /* yes, it is, so they are connected and we are going to enable it as well,
                     * it is not necessary to call recursive lys_set_enable_() because we already
                     * know that there is no disabled import to enable */
                    mod->disabled = 0;
                    ly_set_add(mods, mod, 0);
                    for (w = 0; w < mod->inc_size; w++) {
                        mod->inc[w].submodule->disabled = 0;
                    }
                    /* we have to start again because some of the already checked modules can
                     * depend on the one we have just decided to enable */
                    goto checkdependency;
                }
            }
        }

        /* this module is disabled, but it does not depend on any other disabled module and none
         * of its imports was not enabled in this call. No future enabling of the disabled module
         * will change this so we can remember the module and skip it next time we will have to go
         * through the all context because of the checkdependency goto.
         */
        ly_set_add(disabled, mod, 0);
    }

    /* maintain backlinks (start with internal ietf-yang-library which have leafs as possible targets of leafrefs */
    ctx_modules_redo_backlinks(mods);

    /* re-apply the deviations and augments */
    for (v = 0; v < mods->number; v++) {
        if (((struct lys_module *)mods->set.g[v])->implemented) {
            lys_sub_module_apply_devs_augs((struct lys_module *)mods->set.g[v]);
        }
    }

    /* free the sets */
    ly_set_free(mods);
    ly_set_free(disabled);

    /* update the module-set-id */
    ctx->models.module_set_id++;

    return EXIT_SUCCESS;
}